

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O1

Result * validateTrainingInputs<CoreML::Specification::NeuralNetwork>
                   (Result *__return_storage_ptr__,ModelDescription *modelDescription,
                   NeuralNetwork *nn)

{
  string *psVar1;
  pointer pcVar2;
  Rep *pRVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  Type *pTVar7;
  Type *b;
  LogMessage *pLVar8;
  long lVar9;
  long lVar10;
  undefined8 *puVar11;
  long *plVar12;
  long *plVar13;
  NetworkUpdateParameters *pNVar14;
  ulong uVar15;
  FeatureType *b_00;
  char *pcVar16;
  FeatureType *pFVar17;
  int iVar18;
  RepeatedPtrFieldBase *this;
  bool bVar19;
  bool bVar20;
  string trainingInputTarget;
  vector<int,_std::allocator<int>_> trainingInputExclusiveIndices;
  string err;
  string targetTypeString;
  string typeString;
  string target;
  Result r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  int *local_278;
  iterator iStack_270;
  int *local_268;
  string local_260;
  RepeatedPtrFieldBase *local_240;
  long local_238;
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  long *local_1b0 [2];
  long local_1a0 [2];
  long *local_190 [2];
  long local_180 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  LogMessage local_150;
  long local_118;
  void **local_110;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  Result local_c8;
  LogMessage local_a0;
  LogMessage local_68;
  
  CoreML::Result::Result(&local_c8);
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  local_260._M_string_length = 0;
  local_260.field_2._M_local_buf[0] = '\0';
  if ((modelDescription->traininginput_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    std::__cxx11::string::_M_replace((ulong)&local_260,0,(char *)0x0,0x627b55);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_260);
    goto LAB_00500621;
  }
  local_278 = (int *)0x0;
  iStack_270._M_current = (int *)0x0;
  local_268 = (int *)0x0;
  local_150.level_ = LOGLEVEL_INFO;
  iVar18 = (modelDescription->traininginput_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar18) {
    do {
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&(modelDescription->traininginput_).super_RepeatedPtrFieldBase,
                          local_150.level_);
      if ((modelDescription->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
LAB_004ffc26:
        if (iStack_270._M_current == local_268) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_278,iStack_270,(int *)&local_150);
        }
        else {
          *iStack_270._M_current = local_150.level_;
          iStack_270._M_current = iStack_270._M_current + 1;
        }
      }
      else {
        iVar18 = 1;
        bVar19 = false;
        do {
          b = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                        (&(modelDescription->input_).super_RepeatedPtrFieldBase,iVar18 + -1);
          bVar4 = CoreML::Specification::isEquivalent(pTVar7,b);
          if (bVar4) {
            bVar19 = true;
          }
          bVar20 = iVar18 < (modelDescription->input_).super_RepeatedPtrFieldBase.current_size_;
          iVar18 = iVar18 + 1;
        } while (bVar20 && !bVar4);
        if (!bVar19) goto LAB_004ffc26;
      }
      local_150.level_ = local_150.level_ + LOGLEVEL_WARNING;
      iVar18 = (modelDescription->traininginput_).super_RepeatedPtrFieldBase.current_size_;
    } while ((int)local_150.level_ < iVar18);
  }
  if ((long)iStack_270._M_current - (long)local_278 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_260,0,(char *)local_260._M_string_length,0x627bc4);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_260);
  }
  else if ((long)iStack_270._M_current - (long)local_278 >> 2 == (long)iVar18) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_260,0,(char *)local_260._M_string_length,0x627c27);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_260);
  }
  else {
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    local_170._M_string_length = 0;
    local_170.field_2._M_local_buf[0] = '\0';
    pNVar14 = nn->updateparams_;
    if (pNVar14 == (NetworkUpdateParameters *)0x0) {
      pNVar14 = (NetworkUpdateParameters *)
                &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
    }
    if ((pNVar14->losslayers_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar8 = google::protobuf::internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_150,pLVar8);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    iVar18 = (pNVar14->losslayers_).super_RepeatedPtrFieldBase.current_size_;
    if (*(int *)((long)((pNVar14->losslayers_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x24)
        == 10) {
      if (iVar18 < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_150,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar8 = google::protobuf::internal::LogMessage::operator<<
                           (&local_150,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar8);
        google::protobuf::internal::LogMessage::~LogMessage(&local_150);
      }
      if (*(int *)((long)((pNVar14->losslayers_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                  0x24) != 10) {
        CoreML::Specification::CategoricalCrossEntropyLossLayer::default_instance();
      }
LAB_004ffece:
      std::__cxx11::string::_M_assign((string *)&local_170);
    }
    else {
      if (iVar18 < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar8 = google::protobuf::internal::LogMessage::operator<<
                           (&local_a0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_150,pLVar8);
        google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
      }
      if (*(int *)((long)((pNVar14->losslayers_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                  0x24) == 0xb) {
        if ((pNVar14->losslayers_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_150,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar8 = google::protobuf::internal::LogMessage::operator<<
                             (&local_150,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_298,pLVar8);
          google::protobuf::internal::LogMessage::~LogMessage(&local_150);
        }
        if (*(int *)((long)((pNVar14->losslayers_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                    0x24) != 0xb) {
          CoreML::Specification::MeanSquaredErrorLossLayer::default_instance();
        }
        goto LAB_004ffece;
      }
    }
    lVar9 = __dynamic_cast(nn,&CoreML::Specification::NeuralNetwork::typeinfo,
                           &CoreML::Specification::NeuralNetworkClassifier::typeinfo,
                           0xfffffffffffffffe);
    bVar19 = iStack_270._M_current != local_278;
    if (iStack_270._M_current == local_278) {
      bVar4 = false;
    }
    else {
      this = &(modelDescription->traininginput_).super_RepeatedPtrFieldBase;
      uVar15 = 0;
      bVar4 = false;
      local_240 = this;
      local_238 = lVar9;
      do {
        pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (this,local_278[uVar15]);
        psVar1 = (pTVar7->name_).ptr_;
        pcVar2 = (psVar1->_M_dataplus)._M_p;
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,pcVar2,pcVar2 + psVar1->_M_string_length);
        if (((lVar9 == 0) ||
            (psVar1 = (modelDescription->predictedfeaturename_).ptr_,
            local_298._M_string_length != psVar1->_M_string_length)) ||
           ((local_298._M_string_length != 0 &&
            (iVar18 = bcmp(local_298._M_dataplus._M_p,(psVar1->_M_dataplus)._M_p,
                           local_298._M_string_length), iVar18 != 0)))) {
LAB_005004c4:
          iVar18 = 0;
          if (local_170._M_string_length == local_298._M_string_length) {
            if (local_170._M_string_length == 0) {
              bVar4 = true;
            }
            else {
              iVar6 = bcmp(local_170._M_dataplus._M_p,local_298._M_dataplus._M_p,
                           local_170._M_string_length);
              if (iVar6 == 0) {
                bVar4 = true;
              }
            }
          }
        }
        else {
          pRVar3 = (modelDescription->output_).super_RepeatedPtrFieldBase.rep_;
          local_110 = pRVar3->elements;
          if (pRVar3 == (Rep *)0x0) {
            local_110 = (void **)0x0;
          }
          lVar10 = (long)(modelDescription->output_).super_RepeatedPtrFieldBase.current_size_;
          iVar18 = 0xb;
          if (lVar10 != 0) {
            local_118 = lVar10 << 3;
            lVar10 = 0;
            do {
              lVar9 = *(long *)((long)local_110 + lVar10);
              iVar18 = 0;
              bVar20 = false;
              if (local_298._M_string_length == (*(undefined8 **)(lVar9 + 0x10))[1]) {
                if (local_298._M_string_length == 0) {
                  bVar20 = true;
                }
                else {
                  iVar6 = bcmp(local_298._M_dataplus._M_p,(void *)**(undefined8 **)(lVar9 + 0x10),
                               local_298._M_string_length);
                  bVar20 = iVar6 == 0;
                }
              }
              if (bVar20) {
                pFVar17 = pTVar7->type_;
                if (pFVar17 == (FeatureType *)0x0) {
                  pFVar17 = (FeatureType *)&CoreML::Specification::_FeatureType_default_instance_;
                }
                b_00 = *(FeatureType **)(lVar9 + 0x20);
                if (b_00 == (FeatureType *)0x0) {
                  b_00 = (FeatureType *)&CoreML::Specification::_FeatureType_default_instance_;
                }
                bVar5 = CoreML::Specification::operator==(pFVar17,b_00);
                if (bVar5) {
                  iVar18 = 0xb;
                  bVar4 = true;
                }
                else {
                  puVar11 = *(undefined8 **)(lVar9 + 0x20);
                  if (puVar11 == (undefined8 *)0x0) {
                    puVar11 = &CoreML::Specification::_FeatureType_default_instance_;
                  }
                  bVar5 = *(int *)((long)puVar11 + 0x24) == 1;
                  pcVar16 = "String";
                  if (bVar5) {
                    pcVar16 = "Int64";
                  }
                  local_190[0] = local_180;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_190,pcVar16,pcVar16 + (6 - (ulong)bVar5));
                  pFVar17 = pTVar7->type_;
                  if (pFVar17 == (FeatureType *)0x0) {
                    pFVar17 = (FeatureType *)&CoreML::Specification::_FeatureType_default_instance_;
                  }
                  bVar5 = pFVar17->_oneof_case_[0] == 1;
                  pcVar16 = "String";
                  if (bVar5) {
                    pcVar16 = "Int64";
                  }
                  local_1b0[0] = local_1a0;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1b0,pcVar16,pcVar16 + (6 - (ulong)bVar5));
                  std::operator+(&local_e8,"The type of the training input provided: ",&local_298);
                  plVar12 = (long *)std::__cxx11::string::append((char *)&local_e8);
                  local_230 = &local_220;
                  plVar13 = plVar12 + 2;
                  if ((long *)*plVar12 == plVar13) {
                    local_220 = *plVar13;
                    lStack_218 = plVar12[3];
                  }
                  else {
                    local_220 = *plVar13;
                    local_230 = (long *)*plVar12;
                  }
                  local_228 = plVar12[1];
                  *plVar12 = (long)plVar13;
                  plVar12[1] = 0;
                  *(undefined1 *)(plVar12 + 2) = 0;
                  plVar12 = (long *)std::__cxx11::string::_M_append
                                              ((char *)&local_230,(ulong)local_1b0[0]);
                  plVar13 = plVar12 + 2;
                  if ((long *)*plVar12 == plVar13) {
                    local_1c0 = *plVar13;
                    lStack_1b8 = plVar12[3];
                    local_1d0 = &local_1c0;
                  }
                  else {
                    local_1c0 = *plVar13;
                    local_1d0 = (long *)*plVar12;
                  }
                  local_1c8 = plVar12[1];
                  *plVar12 = (long)plVar13;
                  plVar12[1] = 0;
                  *(undefined1 *)(plVar12 + 2) = 0;
                  plVar12 = (long *)std::__cxx11::string::append((char *)&local_1d0);
                  local_210 = &local_200;
                  plVar13 = plVar12 + 2;
                  if ((long *)*plVar12 == plVar13) {
                    local_200 = *plVar13;
                    lStack_1f8 = plVar12[3];
                  }
                  else {
                    local_200 = *plVar13;
                    local_210 = (long *)*plVar12;
                  }
                  local_208 = plVar12[1];
                  *plVar12 = (long)plVar13;
                  plVar12[1] = 0;
                  *(undefined1 *)(plVar12 + 2) = 0;
                  plVar12 = (long *)std::__cxx11::string::_M_append
                                              ((char *)&local_210,(ulong)local_190[0]);
                  local_1f0 = &local_1e0;
                  plVar13 = plVar12 + 2;
                  if ((long *)*plVar12 == plVar13) {
                    local_1e0 = *plVar13;
                    lStack_1d8 = plVar12[3];
                  }
                  else {
                    local_1e0 = *plVar13;
                    local_1f0 = (long *)*plVar12;
                  }
                  local_1e8 = plVar12[1];
                  *plVar12 = (long)plVar13;
                  plVar12[1] = 0;
                  *(undefined1 *)(plVar12 + 2) = 0;
                  plVar12 = (long *)std::__cxx11::string::append((char *)&local_1f0);
                  plVar13 = plVar12 + 2;
                  if ((long *)*plVar12 == plVar13) {
                    local_f8 = *plVar13;
                    lStack_f0 = plVar12[3];
                    local_108 = &local_f8;
                  }
                  else {
                    local_f8 = *plVar13;
                    local_108 = (long *)*plVar12;
                  }
                  local_100 = plVar12[1];
                  *plVar12 = (long)plVar13;
                  plVar12[1] = 0;
                  *(undefined1 *)(plVar12 + 2) = 0;
                  std::__cxx11::string::operator=((string *)&local_260,(string *)&local_108);
                  if (local_108 != &local_f8) {
                    operator_delete(local_108,local_f8 + 1);
                  }
                  if (local_1f0 != &local_1e0) {
                    operator_delete(local_1f0,local_1e0 + 1);
                  }
                  if (local_210 != &local_200) {
                    operator_delete(local_210,local_200 + 1);
                  }
                  if (local_1d0 != &local_1c0) {
                    operator_delete(local_1d0,local_1c0 + 1);
                  }
                  if (local_230 != &local_220) {
                    operator_delete(local_230,local_220 + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                    operator_delete(local_e8._M_dataplus._M_p,
                                    local_e8.field_2._M_allocated_capacity + 1);
                  }
                  CoreML::Result::Result
                            (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_260
                            );
                  if (local_1b0[0] != local_1a0) {
                    operator_delete(local_1b0[0],local_1a0[0] + 1);
                  }
                  if (local_190[0] != local_180) {
                    operator_delete(local_190[0],local_180[0] + 1);
                  }
                  iVar18 = 1;
                }
              }
              lVar9 = local_238;
              this = local_240;
            } while ((!bVar20) && (lVar10 = lVar10 + 8, iVar18 = 0xb, local_118 != lVar10));
          }
          if (iVar18 == 0xb) goto LAB_005004c4;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        if (iVar18 != 0) break;
        uVar15 = uVar15 + 1;
        bVar19 = uVar15 < (ulong)((long)iStack_270._M_current - (long)local_278 >> 2);
      } while (bVar19);
    }
    if (!bVar19) {
      if (bVar4) {
        CoreML::Result::Result(__return_storage_ptr__);
      }
      else {
        if (lVar9 == 0) {
          std::operator+(&local_298,"The training inputs don\'t include the loss layer\'s target: ",
                         &local_170);
        }
        else {
          std::operator+(&local_298,
                         "The training inputs don\'t include the target of the classifier: ",
                         (modelDescription->predictedfeaturename_).ptr_);
        }
        std::__cxx11::string::operator=((string *)&local_260,(string *)&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        CoreML::Result::Result
                  (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_260);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,
                      CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                               local_170.field_2._M_local_buf[0]) + 1);
    }
  }
  if (local_278 != (int *)0x0) {
    operator_delete(local_278,(long)local_268 - (long)local_278);
  }
LAB_00500621:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,
                    CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                             local_260.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_message._M_dataplus._M_p != &local_c8.m_message.field_2) {
    operator_delete(local_c8.m_message._M_dataplus._M_p,
                    local_c8.m_message.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateTrainingInputs(const Specification::ModelDescription& modelDescription, const T& nn) {
    Result r;
    std::string err;

    if (modelDescription.traininginput_size() <= 1) {
        err = "Must provide training inputs for updatable neural network (expecting both input and target for loss function).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    std::vector<int> trainingInputExclusiveIndices;
    for (int i = 0; i < modelDescription.traininginput_size(); i++) {
        const Specification::FeatureDescription& trainingInput = modelDescription.traininginput(i);
        bool trainingInputIsPredictionInput = false;
        for (int j = 0; j < modelDescription.input_size(); j++) {
            const Specification::FeatureDescription& input = modelDescription.input(j);
            if (Specification::isEquivalent(trainingInput, input)) {
                trainingInputIsPredictionInput = true;
                break;
            }
        }
        if (!trainingInputIsPredictionInput) {
            trainingInputExclusiveIndices.push_back(i);
        }
    }

    // Check that training inputs are specified to at least contain the target (which we'll validate is the target further down)
    if (trainingInputExclusiveIndices.size() < 1) {
        err = "Training inputs don't describe required inputs for the loss (needs both the input and the target).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    // Ensure other inputs (excluding the target) are present
    // This should prevent issues where the only training input described is the target itself
    // Given we don't yet know what inputs are explicitly required for training we can't vet beyond this for what model inputs to require
    size_t numberOfNonExclusiveTrainingInputs = static_cast<size_t>(modelDescription.traininginput_size()) - trainingInputExclusiveIndices.size();
    if (numberOfNonExclusiveTrainingInputs <= 0) { // Given at least one input from the inference model's inputs must be supplied this should be positive
        err = "The training inputs must include at least one input from the model itself as required for training (should have at least one input in common with those used for prediction).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    std::string target;
    const Specification::NetworkUpdateParameters& updateParams = nn.updateparams();
    if (updateParams.losslayers(0).has_categoricalcrossentropylosslayer()) {
        target = updateParams.losslayers(0).categoricalcrossentropylosslayer().target();
    } else if (updateParams.losslayers(0).has_meansquarederrorlosslayer()) {
        target = updateParams.losslayers(0).meansquarederrorlosslayer().target();
    }

    bool isClassifier = (dynamic_cast<const Specification::NeuralNetworkClassifier*>(&nn) != nullptr);

    bool trainingInputMeetsRequirement = false;
    for (size_t i = 0; i < trainingInputExclusiveIndices.size(); i++) {
        const Specification::FeatureDescription& trainingInputDescription = modelDescription.traininginput(trainingInputExclusiveIndices[i]);
        std::string trainingInputTarget = trainingInputDescription.name();

        // If the neural network is a classifier, check if the predictedFeatureNames is a training input (and ensure matching types)
        if (isClassifier) {
            if (trainingInputTarget == modelDescription.predictedfeaturename()) {

                // Find the predictedFeatureName's output and use to check types
                for (const auto& output : modelDescription.output()) {
                    if (trainingInputTarget == output.name()) {
                        if (trainingInputDescription.type() == output.type()) {
                            trainingInputMeetsRequirement = true;
                            break;
                        } else {
                            std::string typeString = output.type().has_int64type() ? "Int64" : "String";
                            std::string targetTypeString = trainingInputDescription.type().has_int64type() ? "Int64" : "String";
                            err = "The type of the training input provided: " + trainingInputTarget + " doesn't match the expected type of the classifier. Found: " + targetTypeString + ", expected: " + typeString + ".";
                            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
                        }
                    }
                }
            }
        }

        // If NN was not a classifier (or predictedFeatureName was not in the training inputs), ensure the target is in the training inputs
        if (target == trainingInputTarget) {
            trainingInputMeetsRequirement = true;
        }
    }

    // Raise an error if the target isn't found (or if the target or predictedFeatureNames aren't found for classifiers)
    // Users can supply either / or for a classifier, but if neither is found we'll request the predictedFeatureNames
    if (!trainingInputMeetsRequirement) {
        if (isClassifier) {
            err = "The training inputs don't include the target of the classifier: " + modelDescription.predictedfeaturename();
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
        err = "The training inputs don't include the loss layer's target: " + target;
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    return Result();
}